

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O1

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::lower_bound
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type *k)

{
  rbtree *prVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  iterator *it;
  treeNode<int> *ptVar4;
  treeNode<int> *ptVar5;
  bool bVar6;
  
  prVar1 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  ptVar4 = ((this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_first
           )->parent;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dd18;
  __return_storage_ptr__->m_tree = prVar1;
  ptVar2 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last;
  bVar6 = ptVar4 == ptVar2;
  if (bVar6) {
LAB_00106df6:
    __return_storage_ptr__->m_node = ptVar4;
  }
  else {
    if (ptVar4->value < *k) {
      do {
        ptVar3 = ptVar4->right;
        ptVar5 = ptVar4;
        if (ptVar4->right == prVar1->NIL) {
          do {
            ptVar4 = ptVar5->parent;
            bVar6 = ptVar4->right == ptVar5;
            ptVar5 = ptVar4;
          } while (bVar6);
        }
        else {
          do {
            ptVar4 = ptVar3;
            ptVar3 = ptVar4->left;
          } while (ptVar4->left != prVar1->NIL);
        }
        bVar6 = ptVar4 == ptVar2;
        if (bVar6) goto LAB_00106df6;
      } while (ptVar4->value < *k);
    }
    __return_storage_ptr__->m_node = ptVar4;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dd18;
  __return_storage_ptr__->m_tree = prVar1;
  __return_storage_ptr__->m_node = ptVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator		lower_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (!this->key_comp()(*it, k)) return it;
		}
		return this->end();
	}